

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::IsRFC4843(CNetAddr *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  CNetAddr *pCVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  undefined2 local_b;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_b = 0x120;
    local_9 = 0;
    uVar1 = (this->m_addr)._size;
    uVar4 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar4 = uVar1;
    }
    if (2 < uVar4) {
      pCVar5 = this;
      if (0x10 < uVar1) {
        pCVar5 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      if ((pCVar5->m_addr)._union.direct[0] == ' ') {
        lVar6 = 0;
        do {
          if (lVar6 == 2) {
            if (0x10 < uVar1) {
              this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
            }
            bVar7 = ((this->m_addr)._union.direct[3] & 0xf0U) == 0x10;
            goto LAB_006cfb37;
          }
          lVar2 = lVar6 + 1;
          lVar3 = lVar6 + 1;
          lVar6 = lVar6 + 1;
        } while (*(char *)((long)&local_b + lVar2) == (pCVar5->m_addr)._union.direct[lVar3]);
      }
    }
  }
  bVar7 = false;
LAB_006cfb37:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC4843() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 3>{0x20, 0x01, 0x00}) &&
           (m_addr[3] & 0xF0) == 0x10;
}